

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorSet::MergeFrom(FileDescriptorSet *this,Message *from)

{
  FileDescriptorSet *from_00;
  
  from_00 = DynamicCastToGenerated<google::protobuf::FileDescriptorSet>(from);
  if (from_00 != (FileDescriptorSet *)0x0) {
    MergeFrom(this,from_00);
    return;
  }
  internal::ReflectionOps::Merge(from,&this->super_Message);
  return;
}

Assistant:

void FileDescriptorSet::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.FileDescriptorSet)
  GOOGLE_DCHECK_NE(&from, this);
  const FileDescriptorSet* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<FileDescriptorSet>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.FileDescriptorSet)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.FileDescriptorSet)
    MergeFrom(*source);
  }
}